

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

double loguru::log(double __x)

{
  char *buff_00;
  char *in_RCX;
  uint in_EDX;
  char *in_RSI;
  Verbosity in_EDI;
  double extraout_XMM0_Qa;
  Text local_50;
  Text buff;
  va_list vlist;
  char *format_local;
  uint line_local;
  char *file_local;
  Verbosity verbosity_local;
  
  buff._str._4_4_ = 0x30;
  buff._str._0_4_ = 0x20;
  vtextprintf((loguru *)&local_50,in_RCX,(__va_list_tag *)&buff);
  buff_00 = Text::c_str(&local_50);
  log_to_everywhere(1,in_EDI,in_RSI,in_EDX,"",buff_00);
  Text::~Text(&local_50);
  return extraout_XMM0_Qa;
}

Assistant:

void log(Verbosity verbosity, const char* file, unsigned line, const char* format, ...)
	{
		va_list vlist;
		va_start(vlist, format);
		auto buff = vtextprintf(format, vlist);
		log_to_everywhere(1, verbosity, file, line, "", buff.c_str());
		va_end(vlist);
	}